

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O1

size_t default_decrypt_cid(quicly_cid_encryptor_t *_self,quicly_cid_plaintext_t *plaintext,
                          void *encrypted,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong *puVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t ptbuf [16];
  ulong local_28;
  uint local_20 [2];
  
  puVar4 = &local_28;
  sVar1 = *(size_t *)(*(long *)_self[1].decrypt_cid + 0x10);
  sVar2 = sVar1;
  if ((len == 0) || (sVar3 = 0xffffffffffffffff, sVar2 = len, sVar1 == len)) {
    sVar3 = sVar2;
    (**(code **)(_self[1].decrypt_cid + 0x18))(_self[1].decrypt_cid,&local_28);
    if (sVar3 == 0x10) {
      puVar4 = (ulong *)local_20;
      uVar6 = local_28 >> 0x38 | (local_28 & 0xff000000000000) >> 0x28 |
              (local_28 & 0xff0000000000) >> 0x18 | (local_28 & 0xff00000000) >> 8 |
              (local_28 & 0xff000000) << 8 | (local_28 & 0xff0000) << 0x18 |
              (local_28 & 0xff00) << 0x28 | local_28 << 0x38;
    }
    else {
      uVar6 = 0;
    }
    plaintext->node_id = uVar6;
    uVar5 = *(uint *)puVar4;
    plaintext->master_id =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = ((uint)*(byte *)((long)puVar4 + 6) |
            (uint)*(byte *)((long)puVar4 + 5) << 8 | (uint)(byte)*(uint *)((long)puVar4 + 4) << 0x10
            ) << 8;
    *(uint *)&plaintext->field_0x4 = (byte)plaintext->field_0x4 | uVar5;
    *(uint *)&plaintext->field_0x4 = *(byte *)((long)puVar4 + 7) | uVar5;
    if ((long)puVar4 + (8 - (long)&local_28) != sVar3) {
      __assert_fail("p - ptbuf == len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0xad,
                    "size_t default_decrypt_cid(quicly_cid_encryptor_t *, quicly_cid_plaintext_t *, const void *, size_t)"
                   );
    }
  }
  return sVar3;
}

Assistant:

static size_t default_decrypt_cid(quicly_cid_encryptor_t *_self, quicly_cid_plaintext_t *plaintext, const void *encrypted,
                                  size_t len)
{
    struct st_quicly_default_encrypt_cid_t *self = (void *)_self;
    uint8_t ptbuf[16];
    const uint8_t *p;

    if (len != 0) {
        /* long header packet; decrypt only if given Connection ID matches the expected size */
        if (len != self->cid_decrypt_ctx->algo->block_size)
            return SIZE_MAX;
    } else {
        /* short header packet; we are the one to name the size */
        len = self->cid_decrypt_ctx->algo->block_size;
    }

    /* decrypt */
    ptls_cipher_encrypt(self->cid_decrypt_ctx, ptbuf, encrypted, len);

    /* decode */
    p = ptbuf;
    if (len == 16) {
        plaintext->node_id = quicly_decode64(&p);
    } else {
        plaintext->node_id = 0;
    }
    plaintext->master_id = quicly_decode32(&p);
    plaintext->thread_id = quicly_decode24(&p);
    plaintext->path_id = *p++;
    assert(p - ptbuf == len);

    return len;
}